

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

void __thiscall tcu::CaseTreeNode::~CaseTreeNode(CaseTreeNode *this)

{
  CaseTreeNode *this_00;
  bool bVar1;
  reference ppCVar2;
  __normal_iterator<tcu::CaseTreeNode_**,_std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>_>
  local_28;
  __normal_iterator<tcu::CaseTreeNode_**,_std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>_>
  local_20;
  __normal_iterator<tcu::CaseTreeNode_*const_*,_std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>_>
  local_18;
  const_iterator i;
  CaseTreeNode *this_local;
  
  i._M_current = (CaseTreeNode **)this;
  local_20._M_current =
       (CaseTreeNode **)
       std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::begin
                 (&this->m_children);
  __gnu_cxx::
  __normal_iterator<tcu::CaseTreeNode*const*,std::vector<tcu::CaseTreeNode*,std::allocator<tcu::CaseTreeNode*>>>
  ::__normal_iterator<tcu::CaseTreeNode**>
            ((__normal_iterator<tcu::CaseTreeNode*const*,std::vector<tcu::CaseTreeNode*,std::allocator<tcu::CaseTreeNode*>>>
              *)&local_18,&local_20);
  while( true ) {
    local_28._M_current =
         (CaseTreeNode **)
         std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::end
                   (&this->m_children);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<tcu::CaseTreeNode_*const_*,_std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppCVar2;
    if (this_00 != (CaseTreeNode *)0x0) {
      ~CaseTreeNode(this_00);
      operator_delete(this_00,0x38);
    }
    __gnu_cxx::
    __normal_iterator<tcu::CaseTreeNode_*const_*,_std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::~vector(&this->m_children)
  ;
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

CaseTreeNode::~CaseTreeNode (void)
{
	for (vector<CaseTreeNode*>::const_iterator i = m_children.begin(); i != m_children.end(); ++i)
		delete *i;
}